

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

SQInteger __thiscall SQCompiler::Factor(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  bool bVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQObjectValue SVar6;
  SQOpcode SVar7;
  ulong uVar8;
  SQObject *cons;
  char *s;
  SQFuncState *this_00;
  SQFuncState *pSVar9;
  long lVar10;
  SQFloat value;
  SQObject SVar11;
  SQInteger SStack_80;
  SQObjectPtr constval;
  SQObject local_60;
  SQObjectPtr local_50;
  SQObject constant;
  
  lVar10 = this->_token;
  switch(lVar10) {
  case 0x11c:
    Lex(this);
    SVar7 = _OP_CLONE;
    goto LAB_0011a589;
  case 0x11d:
    SVar4 = 0x11d;
    bVar3 = false;
LAB_0011a313:
    FunctionExp(this,SVar4,bVar3);
    break;
  case 0x11e:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 300:
  case 0x12d:
  case 0x131:
  case 0x132:
  case 0x134:
  case 0x135:
  case 0x137:
  case 0x138:
switchD_0011a02f_caseD_11e:
    Error(this,"expression expected");
    break;
  case 0x11f:
    Lex(this);
    SVar7 = _OP_TYPEOF;
    goto LAB_0011a589;
  case 0x12a:
    Lex(this);
    SVar7 = _OP_RESUME;
    goto LAB_0011a589;
  case 299:
    pSVar9 = this->_fs;
    SVar4 = SQFuncState::PushTarget(pSVar9,-1);
    SQFuncState::AddInstruction(pSVar9,_OP_LOADROOT,SVar4,0,0,0);
    (this->_es).etype = 2;
    this->_token = 0x2e;
    (this->_es).epos = -1;
    return -1;
  case 0x12e:
  case 0x136:
switchD_0011a04c_caseD_102:
    if (lVar10 == 0x136) {
      pSVar9 = this->_fs;
      s = "constructor";
      SStack_80 = 0xb;
LAB_0011a3e9:
      SVar11 = SQFuncState::CreateString(pSVar9,s,SStack_80);
      local_60._unVal = SVar11._unVal;
      local_60._type = SVar11._type;
    }
    else {
      if (lVar10 == 0x12e) {
        pSVar9 = this->_fs;
        s = "this";
        SStack_80 = 4;
        goto LAB_0011a3e9;
      }
      if (lVar10 == 0x102) {
        pSVar9 = this->_fs;
        s = (this->_lex)._svalue;
        SStack_80 = -1;
        goto LAB_0011a3e9;
      }
    }
    Lex(this);
    SVar4 = SQFuncState::GetLocalVariable(this->_fs,&local_60);
    if (SVar4 == -1) {
      SVar4 = SQFuncState::GetOuterVariable(this->_fs,&local_60);
      if (SVar4 == -1) {
        bVar3 = SQFuncState::IsConstant(this->_fs,&local_60,&constant);
        if (!bVar3) {
          SQFuncState::PushTarget(this->_fs,0);
          pSVar9 = this->_fs;
          SVar4 = SQFuncState::PushTarget(pSVar9,-1);
          SVar5 = SQFuncState::GetConstant(this->_fs,&local_60);
          SQFuncState::AddInstruction(pSVar9,_OP_LOAD,SVar4,SVar5,0,0);
          bVar3 = NeedGet(this);
          if (bVar3) {
            Emit2ArgsOP(this,_OP_GET,0);
          }
          (this->_es).etype = 2;
          goto LAB_0011a435;
        }
        constval.super_SQObject._type = OT_NULL;
        constval.super_SQObject._unVal.pTable = (SQTable *)0x0;
        if (constant._type == OT_TABLE) {
          Expect(this,0x2e);
          SVar11 = Expect(this,0x102);
          SVar6 = SVar11._unVal;
          local_50.super_SQObject._type = SVar11._type;
          if ((local_50.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((SVar6.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                      _uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          local_50.super_SQObject._unVal.nInteger = SVar6.nInteger;
          bVar3 = SQTable::Get(constant._unVal.pTable,&local_50,&constval);
          SQObjectPtr::~SQObjectPtr(&local_50);
          if (!bVar3) {
            SQObjectPtr::Null(&constval);
            Error(this,"invalid constant [%s.%s]",&(local_60._unVal.pTable)->_firstfree,
                  &(SVar6.pTable)->_firstfree);
          }
        }
        else {
          SQObjectPtr::operator=(&constval,&constant);
        }
        SVar4 = SQFuncState::PushTarget(this->_fs,-1);
        (this->_es).epos = SVar4;
        if (constval.super_SQObject._type == OT_BOOL) {
          pSVar9 = this->_fs;
          SVar7 = _OP_LOADBOOL;
          SVar6 = constval.super_SQObject._unVal;
LAB_0011a6a2:
          SQFuncState::AddInstruction(pSVar9,SVar7,SVar4,SVar6.nInteger,0,0);
        }
        else if (constval.super_SQObject._type == OT_FLOAT) {
          EmitLoadConstFloat(this,constval.super_SQObject._unVal.fFloat,SVar4);
        }
        else {
          if (constval.super_SQObject._type != OT_INTEGER) {
            pSVar9 = this->_fs;
            SVar6.nInteger = SQFuncState::GetConstant(pSVar9,&constval.super_SQObject);
            SVar7 = _OP_LOAD;
            goto LAB_0011a6a2;
          }
          EmitLoadConstInt(this,constval.super_SQObject._unVal.nInteger,SVar4);
        }
        (this->_es).etype = 1;
        SQObjectPtr::~SQObjectPtr(&constval);
        goto LAB_0011a435;
      }
      bVar3 = NeedGet(this);
      if (bVar3) {
        SVar5 = SQFuncState::PushTarget(this->_fs,-1);
        (this->_es).epos = SVar5;
        SQFuncState::AddInstruction(this->_fs,_OP_GETOUTER,SVar5,SVar4,0,0);
        goto LAB_0011a435;
      }
      (this->_es).etype = 5;
    }
    else {
      SQFuncState::PushTarget(this->_fs,SVar4);
      (this->_es).etype = 4;
    }
    (this->_es).epos = SVar4;
LAB_0011a435:
    return (this->_es).epos;
  case 0x12f:
  case 0x130:
    PrefixIncDec(this,lVar10);
    break;
  case 0x133:
    Lex(this);
    ClassExp(this);
    break;
  case 0x139:
    uVar8 = (this->_lex)._currentline;
LAB_0011a3a1:
    EmitLoadConstInt(this,uVar8,-1);
    goto LAB_0011a57d;
  case 0x13a:
    pSVar9 = this->_fs;
    SVar4 = SQFuncState::PushTarget(pSVar9,-1);
    this_00 = this->_fs;
    cons = &(this->_sourcename).super_SQObject;
LAB_0011a357:
    uVar8 = SQFuncState::GetConstant(this_00,cons);
    SVar7 = _OP_LOAD;
    goto LAB_0011a368;
  case 0x13b:
  case 0x13c:
    pSVar9 = this->_fs;
    SVar4 = SQFuncState::PushTarget(pSVar9,-1);
    uVar8 = (ulong)(this->_token == 0x13b);
    SVar7 = _OP_LOADBOOL;
LAB_0011a368:
    SQFuncState::AddInstruction(pSVar9,SVar7,SVar4,uVar8,0,0);
LAB_0011a57d:
    Lex(this);
    break;
  default:
    switch(lVar10) {
    case 0x102:
      goto switchD_0011a04c_caseD_102;
    case 0x103:
      pSVar9 = this->_fs;
      SVar4 = SQFuncState::PushTarget(pSVar9,-1);
      this_00 = this->_fs;
      SVar11 = SQFuncState::CreateString
                         (this_00,(this->_lex)._svalue,(this->_lex)._longstr._size - 1);
      local_60._unVal = SVar11._unVal;
      cons = &local_60;
      local_60._type = SVar11._type;
      goto LAB_0011a357;
    case 0x104:
      uVar8 = (this->_lex)._nvalue;
      goto LAB_0011a3a1;
    case 0x105:
      value = (this->_lex)._fvalue;
LAB_0011a572:
      EmitLoadConstFloat(this,value,-1);
      goto LAB_0011a57d;
    case 0x106:
      Lex(this);
      pSVar9 = this->_fs;
      SVar4 = SQFuncState::PushTarget(pSVar9,-1);
      SQFuncState::AddInstruction(pSVar9,_OP_GETBASE,SVar4,0,0,0);
      (this->_es).etype = 3;
      SVar4 = SQFuncState::TopTarget(this->_fs);
      (this->_es).epos = SVar4;
      return SVar4;
    case 0x107:
      DeleteExpr(this);
      goto LAB_0011a592;
    default:
      if (lVar10 == 0x21) {
        Lex(this);
        SVar7 = _OP_NOT;
      }
      else {
        if (lVar10 == 0x28) {
          Lex(this);
          CommaExpr(this);
          Expect(this,0x29);
          goto LAB_0011a592;
        }
        if (lVar10 == 0x2d) {
          Lex(this);
          if (this->_token == 0x105) {
            value = -(this->_lex)._fvalue;
            goto LAB_0011a572;
          }
          if (this->_token == 0x104) {
            uVar8 = -(this->_lex)._nvalue;
            goto LAB_0011a3a1;
          }
          SVar7 = _OP_NEG;
        }
        else {
          if (lVar10 == 0x40) {
            SVar4 = 0x40;
            bVar3 = true;
            goto LAB_0011a313;
          }
          if (lVar10 == 0x5b) {
            pSVar9 = this->_fs;
            SVar4 = SQFuncState::PushTarget(pSVar9,-1);
            lVar10 = 0;
            SQFuncState::AddInstruction(pSVar9,_OP_NEWOBJ,SVar4,0,0,1);
            SVar2 = (this->_fs->_instructions)._size;
            Lex(this);
            while (this->_token != 0x5d) {
              Expression(this);
              if (this->_token == 0x2c) {
                Lex(this);
              }
              SVar4 = SQFuncState::PopTarget(this->_fs);
              SVar5 = SQFuncState::TopTarget(this->_fs);
              SQFuncState::AddInstruction(this->_fs,_OP_APPENDARRAY,SVar5,SVar4,0,0);
              lVar10 = lVar10 + 1;
            }
            SQFuncState::SetIntructionParam(this->_fs,SVar2 - 1,1,lVar10);
            goto LAB_0011a57d;
          }
          if (lVar10 == 0x7b) {
            pSVar9 = this->_fs;
            SVar4 = SQFuncState::PushTarget(pSVar9,-1);
            SQFuncState::AddInstruction(pSVar9,_OP_NEWOBJ,SVar4,0,0,0);
            Lex(this);
            ParseTableOrClass(this,0x2c,0x7d);
            goto LAB_0011a592;
          }
          if (lVar10 != 0x7e) {
            if (lVar10 == 0x116) {
              pSVar9 = this->_fs;
              SVar4 = SQFuncState::PushTarget(pSVar9,-1);
              SVar7 = _OP_LOADNULLS;
              uVar8 = 1;
              goto LAB_0011a368;
            }
            goto switchD_0011a02f_caseD_11e;
          }
          Lex(this);
          if (this->_token == 0x104) {
            uVar8 = ~(this->_lex)._nvalue;
            goto LAB_0011a3a1;
          }
          SVar7 = _OP_BWNOT;
        }
      }
    }
LAB_0011a589:
    UnaryOP(this,SVar7);
  }
LAB_0011a592:
  (this->_es).etype = 1;
  return -1;
}

Assistant:

SQInteger Factor()
    {
        //_es.etype = EXPR;
        switch(_token)
        {
        case TK_STRING_LITERAL:
            _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_fs->CreateString(_lex._svalue,_lex._longstr.size()-1)));
            Lex();
            break;
        case TK_BASE:
            Lex();
            _fs->AddInstruction(_OP_GETBASE, _fs->PushTarget());
            _es.etype  = BASE;
            _es.epos   = _fs->TopTarget();
            return (_es.epos);
            break;
        case TK_IDENTIFIER:
        case TK_CONSTRUCTOR:
        case TK_THIS:{
                SQObject id;
                SQObject constant;

                switch(_token) {
                    case TK_IDENTIFIER:  id = _fs->CreateString(_lex._svalue);       break;
                    case TK_THIS:        id = _fs->CreateString(_SC("this"),4);        break;
                    case TK_CONSTRUCTOR: id = _fs->CreateString(_SC("constructor"),11); break;
                }

                SQInteger pos = -1;
                Lex();
                if((pos = _fs->GetLocalVariable(id)) != -1) {
                    /* Handle a local variable (includes 'this') */
                    _fs->PushTarget(pos);
                    _es.etype  = LOCAL;
                    _es.epos   = pos;
                }

                else if((pos = _fs->GetOuterVariable(id)) != -1) {
                    /* Handle a free var */
                    if(NeedGet()) {
                        _es.epos  = _fs->PushTarget();
                        _fs->AddInstruction(_OP_GETOUTER, _es.epos, pos);
                        /* _es.etype = EXPR; already default value */
                    }
                    else {
                        _es.etype = OUTER;
                        _es.epos  = pos;
                    }
                }

                else if(_fs->IsConstant(id, constant)) {
                    /* Handle named constant */
                    SQObjectPtr constval;
                    SQObject    constid;
                    if(type(constant) == OT_TABLE) {
                        Expect('.');
                        constid = Expect(TK_IDENTIFIER);
                        if(!_table(constant)->Get(constid, constval)) {
                            constval.Null();
                            Error(_SC("invalid constant [%s.%s]"), _stringval(id), _stringval(constid));
                        }
                    }
                    else {
                        constval = constant;
                    }
                    _es.epos = _fs->PushTarget();

                    /* generate direct or literal function depending on size */
                    SQObjectType ctype = type(constval);
                    switch(ctype) {
                        case OT_INTEGER: EmitLoadConstInt(_integer(constval),_es.epos); break;
                        case OT_FLOAT: EmitLoadConstFloat(_float(constval),_es.epos); break;
                        case OT_BOOL: _fs->AddInstruction(_OP_LOADBOOL, _es.epos, _integer(constval)); break;
                        default: _fs->AddInstruction(_OP_LOAD,_es.epos,_fs->GetConstant(constval)); break;
                    }
                    _es.etype = EXPR;
                }
                else {
                    /* Handle a non-local variable, aka a field. Push the 'this' pointer on
                    * the virtual stack (always found in offset 0, so no instruction needs to
                    * be generated), and push the key next. Generate an _OP_LOAD instruction
                    * for the latter. If we are not using the variable as a dref expr, generate
                    * the _OP_GET instruction.
                    */
                    _fs->PushTarget(0);
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                return _es.epos;
            }
            break;
        case TK_DOUBLE_COLON:  // "::"
            _fs->AddInstruction(_OP_LOADROOT, _fs->PushTarget());
            _es.etype = OBJECT;
            _token = _SC('.'); /* hack: drop into PrefixExpr, case '.'*/
            _es.epos = -1;
            return _es.epos;
            break;
        case TK_NULL:
            _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            Lex();
            break;
        case TK_INTEGER: EmitLoadConstInt(_lex._nvalue,-1); Lex();  break;
        case TK_FLOAT: EmitLoadConstFloat(_lex._fvalue,-1); Lex(); break;
        case TK_TRUE: case TK_FALSE:
            _fs->AddInstruction(_OP_LOADBOOL, _fs->PushTarget(),_token == TK_TRUE?1:0);
            Lex();
            break;
        case _SC('['): {
                _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,0,NOT_ARRAY);
                SQInteger apos = _fs->GetCurrentPos(),key = 0;
                Lex();
                while(_token != _SC(']')) {
                    Expression();
                    if(_token == _SC(',')) Lex();
                    SQInteger val = _fs->PopTarget();
                    SQInteger array = _fs->TopTarget();
                    _fs->AddInstruction(_OP_APPENDARRAY, array, val, AAT_STACK);
                    key++;
                }
                _fs->SetIntructionParam(apos, 1, key);
                Lex();
            }
            break;
        case _SC('{'):
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            Lex();ParseTableOrClass(_SC(','),_SC('}'));
            break;
        case TK_FUNCTION: FunctionExp(_token);break;
        case _SC('@'): FunctionExp(_token,true);break;
        case TK_CLASS: Lex(); ClassExp();break;
        case _SC('-'):
            Lex();
            switch(_token) {
            case TK_INTEGER: EmitLoadConstInt(-_lex._nvalue,-1); Lex(); break;
            case TK_FLOAT: EmitLoadConstFloat(-_lex._fvalue,-1); Lex(); break;
            default: UnaryOP(_OP_NEG);
            }
            break;
        case _SC('!'): Lex(); UnaryOP(_OP_NOT); break;
        case _SC('~'):
            Lex();
            if(_token == TK_INTEGER)  { EmitLoadConstInt(~_lex._nvalue,-1); Lex(); break; }
            UnaryOP(_OP_BWNOT);
            break;
        case TK_TYPEOF : Lex() ;UnaryOP(_OP_TYPEOF); break;
        case TK_RESUME : Lex(); UnaryOP(_OP_RESUME); break;
        case TK_CLONE : Lex(); UnaryOP(_OP_CLONE); break;
        case TK_MINUSMINUS :
        case TK_PLUSPLUS :PrefixIncDec(_token); break;
        case TK_DELETE : DeleteExpr(); break;
        case _SC('('): Lex(); CommaExpr(); Expect(_SC(')'));
            break;
        case TK___LINE__: EmitLoadConstInt(_lex._currentline,-1); Lex(); break;
        case TK___FILE__: _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_sourcename)); Lex(); break;
        default: Error(_SC("expression expected"));
        }
        _es.etype = EXPR;
        return -1;
    }